

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

void __thiscall sf::priv::JoystickImpl::JoystickImpl(JoystickImpl *this)

{
  long lVar1;
  
  this->m_file = -1;
  JoystickState::JoystickState(&this->m_state);
  Joystick::Identification::Identification(&this->m_identification);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    this->m_mapping[lVar1] = '\0';
  }
  return;
}

Assistant:

JoystickImpl::JoystickImpl() :
m_file(-1)
{
    std::fill(m_mapping, m_mapping + ABS_MAX + 1, 0);
}